

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Write(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Gia_Man_t *pInit;
  char *pcVar4;
  Gia_Man_t *pGia;
  int fVerbose;
  int fMiniAig;
  int fUnique;
  int nArgcNew;
  int c;
  char **pArgvNew;
  char *pFileName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  bVar2 = false;
  pGia._4_4_ = 0;
  Extra_UtilGetoptReset();
LAB_00259e5f:
  iVar3 = Extra_UtilGetopt(argc,argv,"umvh");
  if (iVar3 == -1) {
    if (argc - globalUtilOptind == 1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Write(): There is no AIG to write.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        pcVar4 = argv[globalUtilOptind];
        if (bVar1) {
          pInit = Gia_ManIsoCanonicize(pAbc->pGia,pGia._4_4_);
          Gia_AigerWriteSimple(pInit,pcVar4);
          Gia_ManStop(pInit);
        }
        else if (bVar2) {
          Gia_ManWriteMiniAig(pAbc->pGia,pcVar4);
        }
        else {
          Gia_AigerWrite(pAbc->pGia,pcVar4,0,0);
        }
        pAbc_local._4_4_ = 0;
      }
    }
    else {
      Abc_Print(-1,"There is no file name.\n");
      pAbc_local._4_4_ = 1;
    }
    return pAbc_local._4_4_;
  }
  switch(iVar3) {
  case 0x68:
    break;
  default:
    break;
  case 0x6d:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_00259e5f;
  case 0x75:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_00259e5f;
  case 0x76:
    goto switchD_00259e9d_caseD_76;
  }
  Abc_Print(-2,"usage: &w [-umvh] <file>\n");
  Abc_Print(-2,"\t         writes the current AIG into the AIGER file\n");
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-u     : toggle writing canonical AIG structure [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (bVar2) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-m     : toggle writing MiniAIG rather than AIGER [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (pGia._4_4_ != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : the file name\n");
  return 1;
switchD_00259e9d_caseD_76:
  pGia._4_4_ = pGia._4_4_ ^ 1;
  goto LAB_00259e5f;
}

Assistant:

int Abc_CommandAbc9Write( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileName;
    char ** pArgvNew;
    int c, nArgcNew;
    int fUnique = 0;
    int fMiniAig = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "umvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'u':
            fUnique ^= 1;
            break;
        case 'm':
            fMiniAig ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Write(): There is no AIG to write.\n" );
        return 1;
    }
    pFileName = argv[globalUtilOptind];
    if ( fUnique )
    {
        Gia_Man_t * pGia = Gia_ManIsoCanonicize( pAbc->pGia, fVerbose );
        Gia_AigerWriteSimple( pGia, pFileName );
        Gia_ManStop( pGia );
    }
    else if ( fMiniAig )
        Gia_ManWriteMiniAig( pAbc->pGia, pFileName );
    else
        Gia_AigerWrite( pAbc->pGia, pFileName, 0, 0 );
    return 0;

usage:
    Abc_Print( -2, "usage: &w [-umvh] <file>\n" );
    Abc_Print( -2, "\t         writes the current AIG into the AIGER file\n" );
    Abc_Print( -2, "\t-u     : toggle writing canonical AIG structure [default = %s]\n", fUnique? "yes" : "no" );
    Abc_Print( -2, "\t-m     : toggle writing MiniAIG rather than AIGER [default = %s]\n", fMiniAig? "yes" : "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}